

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viras.h
# Opt level: O3

FlattenIter<viras::iter::MapIter<viras::iter::FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:367:39)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_h:136:26)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:207:24)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_h:253:26)>_>
* __thiscall
viras::
Viras<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
::quantifier_elimination
          (FlattenIter<viras::iter::MapIter<viras::iter::FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:367:39)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_h:136:26)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:207:24)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_h:253:26)>_>
           *__return_storage_ptr__,
          Viras<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
          *this,Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
                *x,vector<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_std::allocator<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>_>
                   *lits)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>
  *pCVar4;
  uint64_t uVar5;
  _Rb_tree<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::_Identity<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::less<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::allocator<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
  *p_Var6;
  bool bVar7;
  _Rb_tree_color _Var8;
  type *ptVar9;
  bool bVar10;
  _Variant_storage<_98354317_> local_1b20;
  char local_1630;
  undefined1 local_1628;
  _Rb_tree<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::_Identity<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::less<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::allocator<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
  _Stack_1620;
  Viras<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  *local_15f0;
  vector<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_std::allocator<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>_>
  *pvStack_15e8;
  Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>
  *local_15e0;
  TermList TStack_15d8;
  unsigned_long local_15c8;
  unsigned_long uStack_15c0;
  vector<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_std::allocator<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>_>
  *local_15b8;
  Viras<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
  *pVStack_15b0;
  Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
  *local_15a8;
  _Variant_storage<_98354317_> local_15a0;
  char local_10b0;
  undefined1 local_10a8;
  _Rb_tree<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::_Identity<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::less<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::allocator<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
  local_10a0;
  unsigned_long local_1068;
  unsigned_long uStack_1060;
  vector<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_std::allocator<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>_>
  *local_1058;
  Viras<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
  *pVStack_1050;
  Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
  *local_1048;
  _Variant_storage<_98354317_> local_1040;
  char local_b50;
  undefined1 local_b48;
  _Rb_tree<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::_Identity<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::less<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::allocator<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
  local_b40;
  MapIter<viras::iter::FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:367:39)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_h:136:26)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:207:24)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_h:253:26)>
  local_b08;
  FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:367:39)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_h:136:26)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:207:24)>
  local_588;
  
  elim_set(&local_588,this,x,lits);
  bVar7 = local_588.i.inner.super__Optional_base<_163239de_>._M_payload.
          super__Optional_payload<_785ce8e0_>.super__Optional_payload_base<_5183a6a2_>._M_engaged;
  pCVar4 = (x->
           super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>::VarWrapper>
           ).config;
  uVar5 = (x->
          super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>::VarWrapper>
          ).inner.super_TermList._content;
  local_15a8 = local_588.i.outer.f.x;
  local_15b8 = local_588.i.outer.i.f.a;
  pVStack_15b0 = local_588.i.outer.f.this;
  local_15c8 = local_588.i.outer.i.i.lower;
  uStack_15c0 = local_588.i.outer.i.i.upper;
  local_10b0 = 0;
  bVar10 = local_588.i.inner.super__Optional_base<_163239de_>._M_payload.
           super__Optional_payload<_785ce8e0_>.super__Optional_payload_base<_5183a6a2_>._M_engaged
           == true;
  if (bVar10) {
    std::__detail::__variant::_Move_ctor_base<$98354317$>::_Move_ctor_base
              ((_Move_ctor_base<_98354317_> *)&local_15a0,
               (_Move_ctor_base<_98354317_> *)&local_588.i.inner);
  }
  p_Var1 = &local_10a0._M_impl.super__Rb_tree_header;
  local_10a8 = local_588.i.init;
  if (local_588.f.set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    ptVar9 = (type *)&local_10a0._M_impl;
    local_10a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_10a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_10a0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_10a0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  else {
    p_Var2 = &local_588.f.set._M_t._M_impl.super__Rb_tree_header._M_header;
    local_10a0._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_588.f.set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    (local_588.f.set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &p_Var1->_M_header;
    ptVar9 = &local_588.f;
    local_10a0._M_impl.super__Rb_tree_header._M_node_count =
         local_588.f.set._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_588.f.set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_10a0._M_impl.super__Rb_tree_header._M_header._M_left =
         local_588.f.set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_10a0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_588.f.set._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    local_10a0._M_impl.super__Rb_tree_header._M_header._M_color =
         local_588.f.set._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    local_588.f.set._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var2;
    local_588.f.set._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Var2;
  }
  *(size_t *)((long)&(ptVar9->set)._M_t._M_impl + 0x28) = 0;
  local_1048 = local_15a8;
  local_1058 = local_15b8;
  pVStack_1050 = pVStack_15b0;
  local_1068 = local_15c8;
  uStack_1060 = uStack_15c0;
  local_b50 = 0;
  local_10b0 = bVar10;
  if (bVar7 != false) {
    std::__detail::__variant::_Move_ctor_base<$98354317$>::_Move_ctor_base
              ((_Move_ctor_base<_98354317_> *)&local_1040,(_Move_ctor_base<_98354317_> *)&local_15a0
              );
  }
  p_Var3 = &local_b40._M_impl.super__Rb_tree_header;
  if (local_10a0._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    p_Var6 = &local_b40;
    local_b40._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Var8 = _S_red;
    local_b40._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
    local_b40._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  }
  else {
    p_Var6 = &local_10a0;
    local_b40._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_10a0._M_impl.super__Rb_tree_header._M_header._M_parent;
    (local_10a0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var3->_M_header;
    local_b40._M_impl.super__Rb_tree_header._M_node_count =
         local_10a0._M_impl.super__Rb_tree_header._M_node_count;
    local_10a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_b40._M_impl.super__Rb_tree_header._M_header._M_left =
         local_10a0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_b40._M_impl.super__Rb_tree_header._M_header._M_right =
         local_10a0._M_impl.super__Rb_tree_header._M_header._M_right;
    _Var8 = local_10a0._M_impl.super__Rb_tree_header._M_header._M_color;
    local_10a0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_10a0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  local_b50 = bVar7 != false;
  local_b48 = local_10a8;
  (p_Var6->_M_impl).super__Rb_tree_header._M_node_count = 0;
  local_b08.i.i.outer.f.x = local_1048;
  local_b08.i.i.outer.f.this = pVStack_1050;
  local_b08.i.i.outer.i.f.a = local_1058;
  local_b08.i.i.outer.i.i.upper = uStack_1060;
  local_b08.i.i.outer.i.i.lower = local_1068;
  local_1630 = 0;
  bVar10 = bVar7 != false;
  local_1628 = local_10a8;
  local_b40._M_impl.super__Rb_tree_header._M_header._M_color = _Var8;
  if (bVar10) {
    std::__detail::__variant::_Move_ctor_base<$98354317$>::_Move_ctor_base
              ((_Move_ctor_base<_98354317_> *)&local_1b20,(_Move_ctor_base<_98354317_> *)&local_1040
              );
    local_1628 = local_b48;
  }
  _Stack_1620._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_1620._M_impl.super__Rb_tree_header._M_header;
  if (local_b40._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    p_Var6 = &_Stack_1620;
    _Stack_1620._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_1620._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    _Stack_1620._M_impl.super__Rb_tree_header._M_header._M_right =
         _Stack_1620._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  else {
    p_Var6 = &local_b40;
    _Stack_1620._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_b40._M_impl.super__Rb_tree_header._M_header._M_parent;
    (local_b40._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         _Stack_1620._M_impl.super__Rb_tree_header._M_header._M_left;
    _Stack_1620._M_impl.super__Rb_tree_header._M_node_count =
         local_b40._M_impl.super__Rb_tree_header._M_node_count;
    local_b40._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_1620._M_impl.super__Rb_tree_header._M_header._M_left =
         local_b40._M_impl.super__Rb_tree_header._M_header._M_left;
    _Stack_1620._M_impl.super__Rb_tree_header._M_header._M_right =
         local_b40._M_impl.super__Rb_tree_header._M_header._M_right;
    _Stack_1620._M_impl.super__Rb_tree_header._M_header._M_color =
         local_b40._M_impl.super__Rb_tree_header._M_header._M_color;
    local_b40._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
    local_b40._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  }
  (p_Var6->_M_impl).super__Rb_tree_header._M_node_count = 0;
  local_b08.i.i.inner.super__Optional_base<_163239de_>._M_payload.
  super__Optional_payload<_785ce8e0_>.super__Optional_payload_base<_5183a6a2_>._M_engaged = false;
  local_1630 = bVar10;
  local_15f0 = this;
  pvStack_15e8 = lits;
  local_15e0 = pCVar4;
  TStack_15d8._content = uVar5;
  if (bVar7 != false) {
    std::__detail::__variant::_Copy_ctor_base<$98354317$>::_Copy_ctor_base
              ((_Copy_ctor_base<_98354317_> *)&local_b08.i.i.inner,
               (_Copy_ctor_base<_98354317_> *)&local_1b20);
  }
  ptVar9 = &local_b08.i.f;
  local_b08.i.i.inner.super__Optional_base<_163239de_>._M_payload.
  super__Optional_payload<_785ce8e0_>.super__Optional_payload_base<_5183a6a2_>._M_engaged =
       bVar7 != false;
  local_b08.i.i.init = (bool)local_1628;
  std::
  _Rb_tree<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::_Identity<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::less<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::allocator<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
  ::_Rb_tree((_Rb_tree<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::_Identity<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::less<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::allocator<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
              *)ptVar9,&_Stack_1620);
  local_b08.f.x.
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>::VarWrapper>
  .config = local_15e0;
  local_b08.f.x.
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>::VarWrapper>
  .inner.super_TermList._content = (TermList)(TermList)TStack_15d8._content;
  local_b08.f.this =
       (Viras<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
        *)local_15f0;
  local_b08.f.lits = pvStack_15e8;
  viras::iter::
  FlattenIter<viras::iter::MapIter<viras::iter::FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras/iter.h:367:39)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras.h:136:26)>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras/iter.h:207:24)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras.h:253:26)>_>
  ::FlattenIter(__return_storage_ptr__,&local_b08);
  std::
  _Rb_tree<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::_Identity<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::less<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::allocator<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
  ::~_Rb_tree((_Rb_tree<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::_Identity<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::less<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::allocator<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
               *)ptVar9);
  if (local_b08.i.i.inner.super__Optional_base<_163239de_>._M_payload.
      super__Optional_payload<_785ce8e0_>.super__Optional_payload_base<_5183a6a2_>._M_engaged ==
      true) {
    local_b08.i.i.inner.super__Optional_base<_163239de_>._M_payload.
    super__Optional_payload<_785ce8e0_>.super__Optional_payload_base<_5183a6a2_>._M_engaged = false;
    std::__detail::__variant::_Variant_storage<$98354317$>::~_Variant_storage
              ((_Variant_storage<_98354317_> *)&local_b08.i.i.inner);
  }
  std::
  _Rb_tree<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::_Identity<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::less<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::allocator<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
  ::~_Rb_tree(&_Stack_1620);
  if (local_1630 == '\x01') {
    local_1630 = '\0';
    std::__detail::__variant::_Variant_storage<$98354317$>::~_Variant_storage(&local_1b20);
  }
  std::
  _Rb_tree<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::_Identity<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::less<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::allocator<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
  ::~_Rb_tree(&local_b40);
  if (local_b50 == '\x01') {
    local_b50 = '\0';
    std::__detail::__variant::_Variant_storage<$98354317$>::~_Variant_storage(&local_1040);
  }
  std::
  _Rb_tree<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::_Identity<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::less<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::allocator<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
  ::~_Rb_tree(&local_10a0);
  if (local_10b0 == '\x01') {
    local_10b0 = '\0';
    std::__detail::__variant::_Variant_storage<$98354317$>::~_Variant_storage(&local_15a0);
  }
  std::
  _Rb_tree<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::_Identity<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::less<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::allocator<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
  ::~_Rb_tree((_Rb_tree<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::_Identity<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::less<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::allocator<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
               *)&local_588.f);
  if (local_588.i.inner.super__Optional_base<_163239de_>._M_payload.
      super__Optional_payload<_785ce8e0_>.super__Optional_payload_base<_5183a6a2_>._M_engaged ==
      true) {
    local_588.i.inner.super__Optional_base<_163239de_>._M_payload.
    super__Optional_payload<_785ce8e0_>.super__Optional_payload_base<_5183a6a2_>._M_engaged = false;
    std::__detail::__variant::_Variant_storage<$98354317$>::~_Variant_storage
              ((_Variant_storage<_98354317_> *)&local_588.i.inner);
  }
  return __return_storage_ptr__;
}

Assistant:

auto quantifier_elimination(Var<C> const& x, std::vector<LiraLiteral<C>> const& lits)
    { return elim_set(x, lits)
        | iter::flat_map([this,&lits,x](auto t) { return vsubs(lits, x, t); }); }